

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_push_scissor(nk_command_buffer *b,nk_rect r)

{
  void *pvVar1;
  float local_28;
  float fStack_24;
  float local_18;
  float fStack_14;
  
  if (b != (nk_command_buffer *)0x0) {
    b->clip = r;
    pvVar1 = nk_command_buffer_push(b,NK_COMMAND_SCISSOR,0x18);
    if (pvVar1 != (void *)0x0) {
      local_28 = r.x;
      fStack_24 = r.y;
      local_18 = r.w;
      fStack_14 = r.h;
      *(short *)((long)pvVar1 + 0x10) = (short)(int)local_28;
      *(short *)((long)pvVar1 + 0x12) = (short)(int)fStack_24;
      if (local_18 <= 0.0) {
        local_18 = 0.0;
      }
      *(short *)((long)pvVar1 + 0x14) = (short)(int)local_18;
      if (fStack_14 <= 0.0) {
        fStack_14 = 0.0;
      }
      *(short *)((long)pvVar1 + 0x16) = (short)(int)fStack_14;
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x2209,"void nk_push_scissor(struct nk_command_buffer *, struct nk_rect)");
}

Assistant:

NK_API void
nk_push_scissor(struct nk_command_buffer *b, struct nk_rect r)
{
    struct nk_command_scissor *cmd;
    NK_ASSERT(b);
    if (!b) return;

    b->clip.x = r.x;
    b->clip.y = r.y;
    b->clip.w = r.w;
    b->clip.h = r.h;
    cmd = (struct nk_command_scissor*)
        nk_command_buffer_push(b, NK_COMMAND_SCISSOR, sizeof(*cmd));

    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
}